

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkPerModifications(string *unit_string,uint64_t match_flags)

{
  pointer pcVar1;
  bool bVar2;
  size_t __pos;
  char *__s;
  size_type __n2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  precise_unit pVar4;
  string local_70;
  string local_50;
  
  if (((uint)match_flags >> 0x15 & 1) == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"per","");
    __pos = findWordOperatorSep(unit_string,&local_50);
    dVar3 = extraout_XMM0_Qa;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      dVar3 = extraout_XMM0_Qa_00;
    }
    if (__pos == 0xffffffffffffffff) {
      bVar2 = true;
    }
    else {
      if (__pos == 0) {
        __s = "1/";
        __n2 = 2;
        __pos = 0;
      }
      else {
        __s = "/";
        __n2 = 1;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 __pos,3,__s,__n2);
      pcVar1 = (unit_string->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + unit_string->_M_string_length);
      pVar4 = unit_from_string_internal(&local_70,match_flags + 0x80000);
      match_flags = pVar4._8_8_;
      dVar3 = pVar4.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      bVar2 = (match_flags & 0xffffffff) == 0xfa94a488 || NAN(dVar3);
    }
    if (!bVar2) goto LAB_003b3d4b;
  }
  dVar3 = NAN;
  match_flags = 0xfa94a488;
LAB_003b3d4b:
  pVar4.base_units_ = (unit_data)(int)match_flags;
  pVar4.commodity_ = (int)(match_flags >> 0x20);
  pVar4.multiplier_ = dVar3;
  return pVar4;
}

Assistant:

static precise_unit
    checkPerModifications(std::string unit_string, std::uint64_t match_flags)
{
    // try changing out any "per" words for division sign
    if ((match_flags & no_per_operators) == 0) {
        auto fnd = findWordOperatorSep(unit_string, "per");
        if (fnd != std::string::npos) {
            if (fnd == 0) {
                unit_string.replace(fnd, 3, "1/");
            } else {
                unit_string.replace(fnd, 3, "/");
            }
            auto retunit = unit_from_string_internal(
                unit_string, match_flags + per_operator1);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}